

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O1

void read_dist(char *path,char *name,distribution *target)

{
  __int32_t *p_Var1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  set_member *psVar4;
  size_t sVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  long lVar8;
  char *pcVar9;
  char *__size;
  bool bVar10;
  long weight;
  char line [256];
  char token [256];
  int local_248;
  undefined4 uStack_244;
  set_member *local_240;
  char local_238 [256];
  char local_138 [264];
  
  if (d_path == (char *)0x0) {
LAB_00102bed:
    env_config::evar = getenv("DSS_CONFIG");
    pcVar9 = ".";
    if (env_config::evar != (char *)0x0) {
      pcVar9 = env_config::evar;
    }
    sprintf(local_238,"%s%c%s",pcVar9,0x2f,path);
    pcVar9 = "r";
    __stream = fopen64(local_238,"r");
    if (__stream == (FILE *)0x0) goto LAB_00102e11;
  }
  else {
    __stream = fopen64(d_path,"r");
    if (__stream == (FILE *)0x0) {
      read_dist_cold_1();
      goto LAB_00102bed;
    }
  }
  lVar8 = 0;
  bVar10 = false;
  while (pcVar9 = fgets(local_238,0x100,__stream), pcVar9 != (char *)0x0) {
    pcVar9 = strchr(local_238,10);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    pcVar9 = strchr(local_238,0x23);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    if (local_238[0] != '\0') {
      if (bVar10) {
        lVar3 = dssncasecmp(local_238,"END",3);
        if (lVar3 == 0) goto LAB_00102dea;
        iVar2 = __isoc99_sscanf(local_238,"%[^|]|%ld",local_138,&local_248);
        bVar10 = true;
        if (iVar2 == 2) {
          pcVar9 = "count";
          lVar3 = dsscasecmp(local_138,"count");
          if (lVar3 == 0) {
            target->count = local_248;
            __size = (char *)(CONCAT44(uStack_244,local_248) << 4);
            psVar4 = (set_member *)malloc((size_t)__size);
            target->list = psVar4;
            if (psVar4 == (set_member *)0x0) goto LAB_00102e1b;
            target->max = 0;
          }
          else {
            sVar5 = strlen(local_138);
            __size = (char *)(long)((int)sVar5 + 1);
            pcVar6 = (char *)malloc((size_t)__size);
            local_240 = target->list;
            local_240[lVar8].text = pcVar6;
            if (pcVar6 == (char *)0x0) goto LAB_00102e20;
            strcpy(pcVar6,local_138);
            iVar2 = target->max + local_248;
            target->max = iVar2;
            local_240[lVar8].weight = (long)iVar2;
            lVar8 = lVar8 + 1;
            bVar10 = true;
          }
        }
      }
      else {
        pcVar9 = strtok(local_238,"\n\t ");
        lVar3 = dsscasecmp(pcVar9,"BEGIN");
        bVar10 = false;
        if (lVar3 == 0) {
          pcVar9 = strtok((char *)0x0,"\n\t ");
          lVar3 = dsscasecmp(pcVar9,name);
          bVar10 = lVar3 == 0;
        }
      }
    }
  }
  if (lVar8 == target->count) {
    target->permute = (long *)0x0;
LAB_00102dea:
    fclose(__stream);
    return;
  }
  read_dist_cold_4();
  pcVar9 = (char *)__stream;
LAB_00102e11:
  __size = local_238;
  read_dist_cold_5();
LAB_00102e1b:
  read_dist_cold_3();
LAB_00102e20:
  read_dist_cold_2();
  pp_Var7 = __ctype_tolower_loc();
  p_Var1 = *pp_Var7;
  lVar8 = (long)*__size;
  if (p_Var1[lVar8] == p_Var1[(char)((FILE *)pcVar9)->_flags]) {
    lVar3 = 1;
    do {
      if ((char)lVar8 == '\0') {
        return;
      }
      lVar8 = (long)__size[lVar3];
      pcVar6 = (char *)((long)&((FILE *)pcVar9)->_flags + lVar3);
      lVar3 = lVar3 + 1;
    } while (p_Var1[lVar8] == p_Var1[*pcVar6]);
  }
  return;
}

Assistant:

void
read_dist(char *path, char *name, distribution *target)
{
FILE     *fp;
char      line[256],
         token[256],
        *c;
long      weight,
         count = 0,
         name_set = 0;

    if (d_path == NULL)
		{
		sprintf(line, "%s%c%s", 
			env_config(CONFIG_TAG, CONFIG_DFLT), PATH_SEP, path);
		fp = fopen(line, "r");
		OPEN_CHECK(fp, line);
		}
	else
		{
		fp = fopen(d_path, "r");
		OPEN_CHECK(fp, d_path);
		}
    while (fgets(line, sizeof(line), fp) != NULL)
        {
        if ((c = strchr(line, '\n')) != NULL)
            *c = '\0';
        if ((c = strchr(line, '#')) != NULL)
            *c = '\0';
        if (*line == '\0')
            continue;

        if (!name_set)
            {
            if (dsscasecmp(strtok(line, "\n\t "), "BEGIN"))
                continue;
            if (dsscasecmp(strtok(NULL, "\n\t "), name))
                continue;
            name_set = 1;
            continue;
            }
        else
            {
            if (!dssncasecmp(line, "END", 3))
                {
                fclose(fp);
                return;
                }
            }

        if (sscanf(line, "%[^|]|%ld", token, &weight) != 2)
            continue;

        if (!dsscasecmp(token, "count"))
            {
            target->count = weight;
            target->list =
                (set_member *)
                    malloc((size_t)(weight * sizeof(set_member)));
            MALLOC_CHECK(target->list);
            target->max = 0;
            continue;
            }
        target->list[count].text =
            (char *) malloc((size_t)((int)strlen(token) + 1));
        MALLOC_CHECK(target->list[count].text);
        strcpy(target->list[count].text, token);
        target->max += weight;
        target->list[count].weight = target->max;

        count += 1;
        } /* while fgets() */

    if (count != target->count)
        {
        fprintf(stderr, "Read error on dist '%s'\n", name);
        fclose(fp);
        exit(1);
        }
	target->permute = (long *)NULL;
    fclose(fp);
    return;
}